

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O1

bool embree::sse2::InstanceIntersector1MB::pointQuery
               (PointQuery *query,PointQueryContext *context,InstancePrimitive *prim)

{
  float *pfVar1;
  float (*pafVar2) [16];
  Instance *pIVar3;
  RTCPointQueryContext *pRVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 uVar9;
  uint uVar10;
  bool bVar11;
  AffineSpace3ff *pAVar12;
  AffineSpace3ff *pAVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [12];
  float fVar22;
  float fVar23;
  undefined1 auVar24 [12];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar32 [12];
  float fVar30;
  float fVar31;
  float fVar35;
  vfloat4 a0;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar36;
  uint uVar40;
  vfloat4 l02;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar41;
  float fVar46;
  float fVar47;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float local_1e8;
  undefined8 local_d8;
  float local_d0;
  float local_cc;
  float local_c8;
  ulong local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  PointQuery *local_98;
  int local_90;
  PointQueryFunction local_88;
  RTCPointQueryContext *local_80;
  float local_78;
  void *local_70;
  undefined8 local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar3 = prim->instance;
  if ((pIVar3->super_Geometry).numTimeSteps == 1) {
    pAVar12 = pIVar3->local2world;
    if ((pIVar3->super_Geometry).field_8.field_0x1 == '\x01') {
      fVar16 = (pAVar12->p).field_0.m128[3];
      fVar57 = (pAVar12->l).vx.field_0.m128[3];
      fVar60 = (pAVar12->l).vy.field_0.m128[3];
      fVar26 = (pAVar12->l).vz.field_0.m128[3];
      fVar51 = (pAVar12->l).vy.field_0.m128[0];
      fVar53 = (pAVar12->l).vy.field_0.m128[1];
      fVar50 = fVar57 * fVar60 + fVar16 * fVar26;
      fVar25 = fVar57 * fVar60 - fVar16 * fVar26;
      fVar28 = fVar16 * fVar16 + fVar57 * fVar57 + -fVar60 * fVar60 + -fVar26 * fVar26;
      fVar48 = fVar16 * fVar16 - fVar57 * fVar57;
      fVar49 = fVar60 * fVar60 + fVar48 + -fVar26 * fVar26;
      fVar62 = fVar57 * fVar26 - fVar16 * fVar60;
      fVar29 = fVar16 * fVar60 + fVar57 * fVar26;
      fVar54 = fVar60 * fVar26 + fVar16 * fVar57;
      fVar30 = fVar60 * fVar26 - fVar16 * fVar57;
      fVar50 = fVar50 + fVar50;
      fVar62 = fVar62 + fVar62;
      fVar48 = fVar26 * fVar26 + fVar48 + -fVar60 * fVar60;
      fVar35 = fVar28 * 1.0 + fVar50 * 0.0 + fVar62 * 0.0;
      fVar23 = fVar28 * 0.0 + fVar50 * 1.0 + fVar62 * 0.0;
      fVar41 = fVar28 * 0.0 + fVar50 * 0.0 + fVar62 * 1.0;
      fVar46 = fVar28 * 0.0 + fVar50 * 0.0 + fVar62 * 0.0;
      fVar54 = fVar54 + fVar54;
      fVar25 = fVar25 + fVar25;
      fVar26 = fVar25 * 1.0 + fVar49 * 0.0 + fVar54 * 0.0;
      fVar17 = fVar25 * 0.0 + fVar49 * 1.0 + fVar54 * 0.0;
      fVar19 = fVar25 * 0.0 + fVar49 * 0.0 + fVar54 * 1.0;
      fVar31 = fVar25 * 0.0 + fVar49 * 0.0 + fVar54 * 0.0;
      local_1e8 = SUB124(*(undefined1 (*) [12])&(pAVar12->l).vx.field_0,0);
      fVar16 = (pAVar12->l).vz.field_0.m128[0];
      fVar57 = (pAVar12->l).vz.field_0.m128[1];
      fVar60 = (pAVar12->l).vz.field_0.m128[2];
      fVar18 = (pAVar12->p).field_0.m128[0];
      fVar15 = (pAVar12->p).field_0.m128[1];
      fVar14 = (pAVar12->p).field_0.m128[2];
      fVar29 = fVar29 + fVar29;
      fVar30 = fVar30 + fVar30;
      fVar47 = fVar29 * 1.0 + fVar30 * 0.0 + fVar48 * 0.0;
      fVar36 = fVar29 * 0.0 + fVar30 * 1.0 + fVar48 * 0.0;
      fVar55 = fVar29 * 0.0 + fVar30 * 0.0 + fVar48 * 1.0;
      fVar20 = fVar29 * 0.0 + fVar30 * 0.0 + fVar48 * 0.0;
      fVar25 = local_1e8 * fVar35 + fVar26 * 0.0 + fVar47 * 0.0;
      fVar28 = local_1e8 * fVar23 + fVar17 * 0.0 + fVar36 * 0.0;
      fVar29 = local_1e8 * fVar41 + fVar19 * 0.0 + fVar55 * 0.0;
      fVar30 = local_1e8 * fVar46 + fVar31 * 0.0 + fVar20 * 0.0;
      fVar50 = fVar51 * fVar35 + fVar53 * fVar26 + fVar47 * 0.0;
      fVar54 = fVar51 * fVar23 + fVar53 * fVar17 + fVar36 * 0.0;
      fVar62 = fVar51 * fVar41 + fVar53 * fVar19 + fVar55 * 0.0;
      fVar61 = fVar51 * fVar46 + fVar53 * fVar31 + fVar20 * 0.0;
      fVar51 = fVar16 * fVar35 + fVar57 * fVar26 + fVar60 * fVar47;
      fVar53 = fVar16 * fVar23 + fVar57 * fVar17 + fVar60 * fVar36;
      fVar48 = fVar16 * fVar41 + fVar57 * fVar19 + fVar60 * fVar55;
      fVar49 = fVar16 * fVar46 + fVar57 * fVar31 + fVar60 * fVar20;
      fVar16 = fVar18 * fVar35 + fVar15 * fVar26 + fVar14 * fVar47 +
               (pAVar12->l).vx.field_0.m128[1] + 0.0;
      fVar57 = fVar18 * fVar23 + fVar15 * fVar17 + fVar14 * fVar36 +
               (pAVar12->l).vx.field_0.m128[2] + 0.0;
      fVar26 = fVar18 * fVar41 + fVar15 * fVar19 + fVar14 * fVar55 +
               (pAVar12->l).vy.field_0.m128[2] + 0.0;
      fVar60 = fVar18 * fVar46 + fVar15 * fVar31 + fVar14 * fVar20 + 0.0;
    }
    else {
      fVar25 = (pAVar12->l).vx.field_0.m128[0];
      fVar28 = (pAVar12->l).vx.field_0.m128[1];
      fVar29 = (pAVar12->l).vx.field_0.m128[2];
      fVar30 = (pAVar12->l).vx.field_0.m128[3];
      fVar50 = (pAVar12->l).vy.field_0.m128[0];
      fVar54 = (pAVar12->l).vy.field_0.m128[1];
      fVar62 = (pAVar12->l).vy.field_0.m128[2];
      fVar61 = (pAVar12->l).vy.field_0.m128[3];
      fVar51 = (pAVar12->l).vz.field_0.m128[0];
      fVar53 = (pAVar12->l).vz.field_0.m128[1];
      fVar48 = (pAVar12->l).vz.field_0.m128[2];
      fVar49 = (pAVar12->l).vz.field_0.m128[3];
      fVar16 = (pAVar12->p).field_0.m128[0];
      fVar57 = (pAVar12->p).field_0.m128[1];
      fVar26 = (pAVar12->p).field_0.m128[2];
      fVar60 = (pAVar12->p).field_0.m128[3];
    }
  }
  else {
    fVar16 = (pIVar3->super_Geometry).fnumTimeSegments;
    fVar57 = (pIVar3->super_Geometry).time_range.lower;
    fVar60 = ((query->time - fVar57) / ((pIVar3->super_Geometry).time_range.upper - fVar57)) *
             fVar16;
    fVar57 = floorf(fVar60);
    fVar16 = fVar16 + -1.0;
    if (fVar16 <= fVar57) {
      fVar57 = fVar16;
    }
    fVar16 = 0.0;
    if (0.0 <= fVar57) {
      fVar16 = fVar57;
    }
    fVar60 = fVar60 - fVar16;
    pAVar12 = pIVar3->local2world + (uint)(int)fVar16;
    pAVar13 = pIVar3->local2world + ((int)fVar16 + 1);
    if ((pIVar3->super_Geometry).field_8.field_0x1 == '\x01') {
      fVar16 = (pAVar12->p).field_0.m128[3];
      fVar57 = (pAVar12->l).vx.field_0.m128[3];
      fVar26 = (pAVar12->l).vy.field_0.m128[3];
      fVar25 = (pAVar12->l).vz.field_0.m128[3];
      fVar28 = (pAVar13->p).field_0.m128[3];
      fVar29 = (pAVar13->l).vx.field_0.m128[3];
      fVar30 = (pAVar13->l).vy.field_0.m128[3];
      fVar51 = (pAVar13->l).vz.field_0.m128[3];
      fVar48 = fVar25 * fVar51 + fVar26 * fVar30 + fVar16 * fVar28 + fVar57 * fVar29;
      fVar53 = -fVar48;
      if (fVar48 < fVar53) {
        fVar51 = -fVar51;
      }
      fVar50 = ABS(fVar48);
      fVar49 = fVar53;
      if (fVar53 <= fVar48) {
        fVar49 = fVar48;
      }
      fVar54 = 1.0 - fVar50;
      if (fVar54 < 0.0) {
        fVar54 = sqrtf(fVar54);
      }
      else {
        fVar54 = SQRT(fVar54);
      }
      fVar62 = 1.5707964 -
               fVar54 * (((((fVar50 * -0.0043095737 + 0.0192803) * fVar50 + -0.04489909) * fVar50 +
                          0.08785567) * fVar50 + -0.21450998) * fVar50 + 1.5707952);
      fVar54 = 0.0;
      if (0.0 <= fVar62) {
        fVar54 = fVar62;
      }
      fVar61 = (float)(-(uint)(1.0 < fVar50) & 0x7fc00000 |
                      ~-(uint)(1.0 < fVar50) &
                      (uint)(1.5707964 -
                            (float)((uint)-fVar54 & -(uint)(fVar49 < 0.0) |
                                   ~-(uint)(fVar49 < 0.0) & (uint)fVar54))) * fVar60;
      fVar62 = floorf(fVar61 * 0.63661975);
      fVar61 = fVar61 - fVar62 * 1.5707964;
      fVar50 = fVar61 * fVar61;
      uVar10 = (int)fVar62 & 3;
      fVar54 = ((((fVar50 * -2.5963018e-07 + 2.4756235e-05) * fVar50 + -0.001388833) * fVar50 +
                0.04166664) * fVar50 + -0.5) * fVar50 + 1.0;
      fVar61 = (((((fVar50 * -2.5029328e-08 + 2.7600126e-06) * fVar50 + -0.00019842605) * fVar50 +
                 0.008333348) * fVar50 + -0.16666667) * fVar50 + 1.0) * fVar61;
      fVar50 = fVar61;
      if (((int)fVar62 & 1U) != 0) {
        fVar50 = fVar54;
        fVar54 = fVar61;
      }
      fVar30 = (float)(~-(uint)(fVar48 < fVar53) & (uint)fVar30 |
                      (uint)-fVar30 & -(uint)(fVar48 < fVar53));
      if (1 < uVar10) {
        fVar50 = -fVar50;
      }
      if (uVar10 - 1 < 2) {
        fVar54 = -fVar54;
      }
      fVar61 = fVar49 * fVar26 - fVar30;
      fVar62 = fVar49 * fVar25 - fVar51;
      fVar15 = 1.0 - fVar60;
      fVar53 = fVar15 * fVar26 + fVar30 * fVar60;
      fVar30 = fVar15 * fVar25 + fVar51 * fVar60;
      uVar10 = (int)((uint)(fVar48 < 0.0) << 0x1f) >> 0x1f;
      uVar40 = (int)((uint)(fVar48 < 0.0) << 0x1f) >> 0x1f;
      fVar51 = (float)((uint)-fVar28 & uVar10 | ~uVar10 & (uint)fVar28);
      fVar18 = (float)((uint)-fVar29 & uVar40 | ~uVar40 & (uint)fVar29);
      fVar29 = fVar49 * fVar16 - fVar51;
      fVar48 = fVar49 * fVar57 - fVar18;
      auVar38._4_4_ = 0x80000000;
      auVar38._0_4_ = fVar62;
      auVar38._8_4_ = 0x80000000;
      auVar38._12_4_ = 0x80000000;
      auVar43._4_12_ = auVar38._4_12_;
      auVar43._0_4_ = fVar62 * fVar62 + fVar61 * fVar61 + fVar29 * fVar29 + fVar48 * fVar48;
      auVar34._4_4_ = 0x80000000;
      auVar34._0_4_ = auVar43._0_4_;
      auVar34._8_4_ = 0x80000000;
      auVar34._12_4_ = 0x80000000;
      auVar34 = rsqrtss(auVar34,auVar43);
      fVar28 = auVar34._0_4_;
      fVar28 = fVar28 * fVar28 * auVar43._0_4_ * -0.5 * fVar28 + fVar28 * 1.5;
      fVar14 = fVar16 * fVar15 + fVar51 * fVar60;
      fVar17 = fVar57 * fVar15 + fVar18 * fVar60;
      fVar18 = fVar30 * fVar30 + fVar53 * fVar53 + fVar14 * fVar14 + fVar17 * fVar17;
      auVar34 = rsqrtss(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18));
      fVar51 = auVar34._0_4_;
      fVar51 = fVar51 * fVar51 * fVar18 * -0.5 * fVar51 + fVar51 * 1.5;
      uVar10 = (int)((uint)(0.9995 < fVar49) << 0x1f) >> 0x1f;
      uVar40 = (int)((uint)(0.9995 < fVar49) << 0x1f) >> 0x1f;
      fVar16 = (float)(~uVar10 & (uint)(fVar54 * fVar16 - fVar50 * fVar28 * fVar29) |
                      (uint)(fVar51 * fVar14) & uVar10);
      fVar57 = (float)(~uVar40 & (uint)(fVar54 * fVar57 - fVar50 * fVar28 * fVar48) |
                      (uint)(fVar51 * fVar17) & uVar40);
      if (0.9995 < fVar49) {
        fVar53 = fVar53 * fVar51;
        fVar30 = fVar30 * fVar51;
      }
      else {
        fVar53 = fVar26 * fVar54 - fVar61 * fVar28 * fVar50;
        fVar30 = fVar25 * fVar54 - fVar62 * fVar28 * fVar50;
      }
      fVar48 = (pAVar12->l).vx.field_0.m128[0] * fVar15 + (pAVar13->l).vx.field_0.m128[0] * fVar60;
      fVar26 = (pAVar12->l).vy.field_0.m128[0] * fVar15 + (pAVar13->l).vy.field_0.m128[0] * fVar60;
      fVar51 = (pAVar12->l).vy.field_0.m128[1] * fVar15 + (pAVar13->l).vy.field_0.m128[1] * fVar60;
      fVar49 = (pAVar12->l).vz.field_0.m128[0] * fVar15 + (pAVar13->l).vz.field_0.m128[0] * fVar60;
      fVar18 = (pAVar12->l).vz.field_0.m128[1] * fVar15 + (pAVar13->l).vz.field_0.m128[1] * fVar60;
      fVar14 = (pAVar12->l).vz.field_0.m128[2] * fVar15 + (pAVar13->l).vz.field_0.m128[2] * fVar60;
      fVar27 = fVar15 * (pAVar12->p).field_0.m128[0] + fVar60 * (pAVar13->p).field_0.m128[0];
      fVar52 = fVar15 * (pAVar12->p).field_0.m128[1] + fVar60 * (pAVar13->p).field_0.m128[1];
      fVar56 = fVar15 * (pAVar12->p).field_0.m128[2] + fVar60 * (pAVar13->p).field_0.m128[2];
      fVar50 = fVar57 * fVar53 + fVar16 * fVar30;
      fVar25 = fVar57 * fVar53 - fVar16 * fVar30;
      fVar62 = fVar16 * fVar16 - fVar57 * fVar57;
      fVar28 = fVar16 * fVar16 + fVar57 * fVar57 + -fVar53 * fVar53 + -fVar30 * fVar30;
      fVar54 = fVar53 * fVar53 + fVar62 + -fVar30 * fVar30;
      fVar17 = fVar57 * fVar30 - fVar16 * fVar53;
      fVar29 = fVar16 * fVar53 + fVar57 * fVar30;
      fVar61 = fVar53 * fVar30 + fVar16 * fVar57;
      fVar16 = fVar53 * fVar30 - fVar16 * fVar57;
      fVar50 = fVar50 + fVar50;
      fVar17 = fVar17 + fVar17;
      fVar57 = fVar30 * fVar30 + fVar62 + -fVar53 * fVar53;
      fVar23 = fVar28 * 1.0 + fVar50 * 0.0 + fVar17 * 0.0;
      fVar41 = fVar28 * 0.0 + fVar50 * 1.0 + fVar17 * 0.0;
      fVar46 = fVar28 * 0.0 + fVar50 * 0.0 + fVar17 * 1.0;
      fVar47 = fVar28 * 0.0 + fVar50 * 0.0 + fVar17 * 0.0;
      fVar61 = fVar61 + fVar61;
      fVar25 = fVar25 + fVar25;
      fVar17 = fVar25 * 1.0 + fVar54 * 0.0 + fVar61 * 0.0;
      fVar19 = fVar25 * 0.0 + fVar54 * 1.0 + fVar61 * 0.0;
      fVar31 = fVar25 * 0.0 + fVar54 * 0.0 + fVar61 * 1.0;
      fVar35 = fVar25 * 0.0 + fVar54 * 0.0 + fVar61 * 0.0;
      fVar29 = fVar29 + fVar29;
      fVar16 = fVar16 + fVar16;
      fVar36 = fVar29 * 1.0 + fVar16 * 0.0 + fVar57 * 0.0;
      fVar55 = fVar29 * 0.0 + fVar16 * 1.0 + fVar57 * 0.0;
      fVar20 = fVar29 * 0.0 + fVar16 * 0.0 + fVar57 * 1.0;
      fVar22 = fVar29 * 0.0 + fVar16 * 0.0 + fVar57 * 0.0;
      fVar25 = fVar48 * fVar23 + fVar17 * 0.0 + fVar36 * 0.0;
      fVar28 = fVar48 * fVar41 + fVar19 * 0.0 + fVar55 * 0.0;
      fVar29 = fVar48 * fVar46 + fVar31 * 0.0 + fVar20 * 0.0;
      fVar30 = fVar48 * fVar47 + fVar35 * 0.0 + fVar22 * 0.0;
      fVar50 = fVar26 * fVar23 + fVar51 * fVar17 + fVar36 * 0.0;
      fVar54 = fVar26 * fVar41 + fVar51 * fVar19 + fVar55 * 0.0;
      fVar62 = fVar26 * fVar46 + fVar51 * fVar31 + fVar20 * 0.0;
      fVar61 = fVar26 * fVar47 + fVar51 * fVar35 + fVar22 * 0.0;
      fVar51 = fVar49 * fVar23 + fVar18 * fVar17 + fVar14 * fVar36;
      fVar53 = fVar49 * fVar41 + fVar18 * fVar19 + fVar14 * fVar55;
      fVar48 = fVar49 * fVar46 + fVar18 * fVar31 + fVar14 * fVar20;
      fVar49 = fVar49 * fVar47 + fVar18 * fVar35 + fVar14 * fVar22;
      fVar16 = fVar27 * fVar23 + fVar52 * fVar17 + fVar56 * fVar36 +
               (pAVar12->l).vx.field_0.m128[1] * fVar15 + (pAVar13->l).vx.field_0.m128[1] * fVar60 +
               0.0;
      fVar57 = fVar27 * fVar41 + fVar52 * fVar19 + fVar56 * fVar55 +
               (pAVar12->l).vx.field_0.m128[2] * fVar15 + (pAVar13->l).vx.field_0.m128[2] * fVar60 +
               0.0;
      fVar26 = fVar27 * fVar46 + fVar52 * fVar31 + fVar56 * fVar20 +
               (pAVar12->l).vy.field_0.m128[2] * fVar15 + (pAVar13->l).vy.field_0.m128[2] * fVar60 +
               0.0;
      fVar60 = fVar27 * fVar47 + fVar52 * fVar35 + fVar56 * fVar22 + 0.0;
    }
    else {
      fVar18 = 1.0 - fVar60;
      fVar25 = (pAVar12->l).vx.field_0.m128[0] * fVar18 + (pAVar13->l).vx.field_0.m128[0] * fVar60;
      fVar28 = (pAVar12->l).vx.field_0.m128[1] * fVar18 + (pAVar13->l).vx.field_0.m128[1] * fVar60;
      fVar29 = (pAVar12->l).vx.field_0.m128[2] * fVar18 + (pAVar13->l).vx.field_0.m128[2] * fVar60;
      fVar30 = (pAVar12->l).vx.field_0.m128[3] * fVar18 + (pAVar13->l).vx.field_0.m128[3] * fVar60;
      fVar50 = (pAVar12->l).vy.field_0.m128[0] * fVar18 + (pAVar13->l).vy.field_0.m128[0] * fVar60;
      fVar54 = (pAVar12->l).vy.field_0.m128[1] * fVar18 + (pAVar13->l).vy.field_0.m128[1] * fVar60;
      fVar62 = (pAVar12->l).vy.field_0.m128[2] * fVar18 + (pAVar13->l).vy.field_0.m128[2] * fVar60;
      fVar61 = (pAVar12->l).vy.field_0.m128[3] * fVar18 + (pAVar13->l).vy.field_0.m128[3] * fVar60;
      fVar51 = (pAVar12->l).vz.field_0.m128[0] * fVar18 + (pAVar13->l).vz.field_0.m128[0] * fVar60;
      fVar53 = (pAVar12->l).vz.field_0.m128[1] * fVar18 + (pAVar13->l).vz.field_0.m128[1] * fVar60;
      fVar48 = (pAVar12->l).vz.field_0.m128[2] * fVar18 + (pAVar13->l).vz.field_0.m128[2] * fVar60;
      fVar49 = (pAVar12->l).vz.field_0.m128[3] * fVar18 + (pAVar13->l).vz.field_0.m128[3] * fVar60;
      fVar16 = fVar18 * (pAVar12->p).field_0.m128[0] + fVar60 * (pAVar13->p).field_0.m128[0];
      fVar57 = fVar18 * (pAVar12->p).field_0.m128[1] + fVar60 * (pAVar13->p).field_0.m128[1];
      fVar26 = fVar18 * (pAVar12->p).field_0.m128[2] + fVar60 * (pAVar13->p).field_0.m128[2];
      fVar60 = fVar18 * (pAVar12->p).field_0.m128[3] + fVar60 * (pAVar13->p).field_0.m128[3];
    }
  }
  if ((pIVar3->super_Geometry).numTimeSteps == 1) {
    auVar34 = *(undefined1 (*) [16])(pIVar3->world2local0).l.vx.field_0.m128;
    auVar38 = *(undefined1 (*) [16])(pIVar3->world2local0).l.vy.field_0.m128;
    auVar43 = *(undefined1 (*) [16])(pIVar3->world2local0).l.vz.field_0.m128;
    fVar18 = (pIVar3->world2local0).p.field_0.m128[0];
    fVar15 = (pIVar3->world2local0).p.field_0.m128[1];
    fVar14 = (pIVar3->world2local0).p.field_0.m128[2];
    fVar17 = (pIVar3->world2local0).p.field_0.m128[3];
  }
  else {
    fVar18 = (pIVar3->super_Geometry).fnumTimeSegments;
    fVar15 = (pIVar3->super_Geometry).time_range.lower;
    fVar14 = ((query->time - fVar15) / ((pIVar3->super_Geometry).time_range.upper - fVar15)) *
             fVar18;
    fVar15 = floorf(fVar14);
    fVar18 = fVar18 + -1.0;
    if (fVar18 <= fVar15) {
      fVar15 = fVar18;
    }
    fVar18 = 0.0;
    if (0.0 <= fVar15) {
      fVar18 = fVar15;
    }
    fVar14 = fVar14 - fVar18;
    pAVar12 = pIVar3->local2world + (uint)(int)fVar18;
    pAVar13 = pIVar3->local2world + ((int)fVar18 + 1);
    if ((pIVar3->super_Geometry).field_8.field_0x1 == '\x01') {
      fVar18 = (pAVar12->p).field_0.m128[3];
      fVar15 = (pAVar12->l).vx.field_0.m128[3];
      fVar17 = (pAVar12->l).vy.field_0.m128[3];
      fVar19 = (pAVar12->l).vz.field_0.m128[3];
      fVar31 = (pAVar13->p).field_0.m128[3];
      fVar35 = (pAVar13->l).vx.field_0.m128[3];
      fVar23 = (pAVar13->l).vy.field_0.m128[3];
      fVar41 = (pAVar13->l).vz.field_0.m128[3];
      fVar47 = fVar19 * fVar41 + fVar17 * fVar23 + fVar18 * fVar31 + fVar15 * fVar35;
      fVar46 = -fVar47;
      if (fVar47 < fVar46) {
        fVar41 = -fVar41;
      }
      fVar55 = ABS(fVar47);
      fVar36 = fVar46;
      if (fVar46 <= fVar47) {
        fVar36 = fVar47;
      }
      fVar20 = 1.0 - fVar55;
      if (fVar20 < 0.0) {
        local_b8 = (ulong)(uint)fVar55;
        uStack_b0 = 0;
        fVar20 = sqrtf(fVar20);
        fVar22 = (float)local_b8;
      }
      else {
        fVar20 = SQRT(fVar20);
        fVar22 = fVar55;
      }
      fVar20 = 1.5707964 -
               fVar20 * (((((fVar55 * -0.0043095737 + 0.0192803) * fVar55 + -0.04489909) * fVar55 +
                          0.08785567) * fVar55 + -0.21450998) * fVar55 + 1.5707952);
      fVar55 = 0.0;
      if (0.0 <= fVar20) {
        fVar55 = fVar20;
      }
      fVar55 = (float)(-(uint)(1.0 < fVar22) & 0x7fc00000 |
                      ~-(uint)(1.0 < fVar22) &
                      (uint)(1.5707964 -
                            (float)((uint)-fVar55 & -(uint)(fVar36 < 0.0) |
                                   ~-(uint)(fVar36 < 0.0) & (uint)fVar55))) * fVar14;
      fVar22 = floorf(fVar55 * 0.63661975);
      fVar55 = fVar55 - fVar22 * 1.5707964;
      fVar20 = fVar55 * fVar55;
      uVar10 = (int)fVar22 & 3;
      fVar27 = ((((fVar20 * -2.5963018e-07 + 2.4756235e-05) * fVar20 + -0.001388833) * fVar20 +
                0.04166664) * fVar20 + -0.5) * fVar20 + 1.0;
      fVar55 = (((((fVar20 * -2.5029328e-08 + 2.7600126e-06) * fVar20 + -0.00019842605) * fVar20 +
                 0.008333348) * fVar20 + -0.16666667) * fVar20 + 1.0) * fVar55;
      fVar20 = fVar27;
      if (((int)fVar22 & 1U) != 0) {
        fVar20 = fVar55;
        fVar55 = fVar27;
      }
      fVar23 = (float)(~-(uint)(fVar47 < fVar46) & (uint)fVar23 |
                      (uint)-fVar23 & -(uint)(fVar47 < fVar46));
      if (1 < uVar10) {
        fVar55 = -fVar55;
      }
      if (uVar10 - 1 < 2) {
        fVar20 = -fVar20;
      }
      fVar46 = fVar36 * fVar17 - fVar23;
      fVar22 = fVar36 * fVar19 - fVar41;
      fVar56 = 1.0 - fVar14;
      fVar23 = fVar56 * fVar17 + fVar23 * fVar14;
      fVar41 = fVar56 * fVar19 + fVar41 * fVar14;
      uVar10 = (int)((uint)(fVar47 < 0.0) << 0x1f) >> 0x1f;
      uVar40 = (int)((uint)(fVar47 < 0.0) << 0x1f) >> 0x1f;
      fVar27 = (float)((uint)-fVar31 & uVar10 | ~uVar10 & (uint)fVar31);
      fVar52 = (float)((uint)-fVar35 & uVar40 | ~uVar40 & (uint)fVar35);
      fVar31 = fVar36 * fVar18 - fVar27;
      fVar35 = fVar36 * fVar15 - fVar52;
      auVar44._4_4_ = 0x80000000;
      auVar44._0_4_ = fVar22;
      auVar44._8_4_ = 0x80000000;
      auVar44._12_4_ = 0x80000000;
      auVar45._4_12_ = auVar44._4_12_;
      auVar45._0_4_ = fVar22 * fVar22 + fVar46 * fVar46 + fVar31 * fVar31 + fVar35 * fVar35;
      auVar39._4_4_ = 0x80000000;
      auVar39._0_4_ = auVar45._0_4_;
      auVar39._8_4_ = 0x80000000;
      auVar39._12_4_ = 0x80000000;
      auVar34 = rsqrtss(auVar39,auVar45);
      fVar47 = auVar34._0_4_;
      fVar47 = fVar47 * fVar47 * auVar45._0_4_ * -0.5 * fVar47 + fVar47 * 1.5;
      fVar63 = fVar18 * fVar56 + fVar27 * fVar14;
      fVar65 = fVar15 * fVar56 + fVar52 * fVar14;
      fVar52 = fVar41 * fVar41 + fVar23 * fVar23 + fVar63 * fVar63 + fVar65 * fVar65;
      auVar34 = rsqrtss(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52));
      fVar27 = auVar34._0_4_;
      fVar27 = fVar27 * fVar27 * fVar52 * -0.5 * fVar27 + fVar27 * 1.5;
      uVar10 = (int)((uint)(0.9995 < fVar36) << 0x1f) >> 0x1f;
      uVar40 = (int)((uint)(0.9995 < fVar36) << 0x1f) >> 0x1f;
      fVar18 = (float)(~uVar10 & (uint)(fVar20 * fVar18 - fVar55 * fVar47 * fVar31) |
                      (uint)(fVar27 * fVar63) & uVar10);
      fVar15 = (float)(~uVar40 & (uint)(fVar20 * fVar15 - fVar55 * fVar47 * fVar35) |
                      (uint)(fVar27 * fVar65) & uVar40);
      if (0.9995 < fVar36) {
        fVar23 = fVar23 * fVar27;
        fVar41 = fVar41 * fVar27;
      }
      else {
        fVar23 = fVar17 * fVar20 - fVar46 * fVar47 * fVar55;
        fVar41 = fVar19 * fVar20 - fVar22 * fVar47 * fVar55;
      }
      fVar17 = (pAVar12->l).vx.field_0.m128[0] * fVar56 + (pAVar13->l).vx.field_0.m128[0] * fVar14;
      fVar19 = (pAVar12->l).vy.field_0.m128[0] * fVar56 + (pAVar13->l).vy.field_0.m128[0] * fVar14;
      fVar31 = (pAVar12->l).vy.field_0.m128[1] * fVar56 + (pAVar13->l).vy.field_0.m128[1] * fVar14;
      fVar35 = (pAVar12->l).vz.field_0.m128[0] * fVar56 + (pAVar13->l).vz.field_0.m128[0] * fVar14;
      fVar46 = (pAVar12->l).vz.field_0.m128[1] * fVar56 + (pAVar13->l).vz.field_0.m128[1] * fVar14;
      fVar47 = (pAVar12->l).vz.field_0.m128[2] * fVar56 + (pAVar13->l).vz.field_0.m128[2] * fVar14;
      fVar65 = fVar56 * (pAVar12->p).field_0.m128[0] + fVar14 * (pAVar13->p).field_0.m128[0];
      fVar58 = fVar56 * (pAVar12->p).field_0.m128[1] + fVar14 * (pAVar13->p).field_0.m128[1];
      fVar59 = fVar56 * (pAVar12->p).field_0.m128[2] + fVar14 * (pAVar13->p).field_0.m128[2];
      fVar52 = fVar15 * fVar23 + fVar18 * fVar41;
      fVar36 = fVar15 * fVar23 - fVar18 * fVar41;
      fVar20 = fVar18 * fVar18 - fVar15 * fVar15;
      fVar55 = fVar18 * fVar18 + fVar15 * fVar15 + -fVar23 * fVar23 + -fVar41 * fVar41;
      fVar63 = fVar23 * fVar23 + fVar20 + -fVar41 * fVar41;
      fVar66 = fVar15 * fVar41 - fVar18 * fVar23;
      fVar27 = fVar18 * fVar23 + fVar15 * fVar41;
      fVar64 = fVar23 * fVar41 + fVar18 * fVar15;
      fVar18 = fVar23 * fVar41 - fVar18 * fVar15;
      fVar52 = fVar52 + fVar52;
      fVar66 = fVar66 + fVar66;
      fVar15 = fVar41 * fVar41 + fVar20 + -fVar23 * fVar23;
      fVar20 = fVar55 * 1.0 + fVar52 * 0.0 + fVar66 * 0.0;
      fVar22 = fVar55 * 0.0 + fVar52 * 1.0 + fVar66 * 0.0;
      fVar55 = fVar55 * 0.0 + fVar52 * 0.0 + fVar66 * 1.0;
      fVar64 = fVar64 + fVar64;
      fVar36 = fVar36 + fVar36;
      fVar23 = fVar36 * 1.0 + fVar63 * 0.0 + fVar64 * 0.0;
      fVar41 = fVar36 * 0.0 + fVar63 * 1.0 + fVar64 * 0.0;
      fVar36 = fVar36 * 0.0 + fVar63 * 0.0 + fVar64 * 1.0;
      fVar27 = fVar27 + fVar27;
      fVar18 = fVar18 + fVar18;
      fVar52 = fVar27 * 1.0 + fVar18 * 0.0 + fVar15 * 0.0;
      fVar63 = fVar27 * 0.0 + fVar18 * 1.0 + fVar15 * 0.0;
      fVar27 = fVar27 * 0.0 + fVar18 * 0.0 + fVar15 * 1.0;
      fVar18 = fVar17 * fVar20 + fVar23 * 0.0 + fVar52 * 0.0;
      fVar15 = fVar17 * fVar22 + fVar41 * 0.0 + fVar63 * 0.0;
      fVar17 = fVar17 * fVar55 + fVar36 * 0.0 + fVar27 * 0.0;
      auVar32._0_4_ = fVar19 * fVar20 + fVar31 * fVar23 + fVar52 * 0.0;
      auVar32._4_4_ = fVar19 * fVar22 + fVar31 * fVar41 + fVar63 * 0.0;
      auVar32._8_4_ = fVar19 * fVar55 + fVar31 * fVar36 + fVar27 * 0.0;
      auVar24._0_4_ = fVar35 * fVar20 + fVar46 * fVar23 + fVar47 * fVar52;
      auVar24._4_4_ = fVar35 * fVar22 + fVar46 * fVar41 + fVar47 * fVar63;
      auVar24._8_4_ = fVar35 * fVar55 + fVar46 * fVar36 + fVar47 * fVar27;
      auVar21._0_4_ =
           fVar65 * fVar20 + fVar58 * fVar23 + fVar59 * fVar52 +
           (pAVar12->l).vx.field_0.m128[1] * fVar56 + (pAVar13->l).vx.field_0.m128[1] * fVar14 + 0.0
      ;
      auVar21._4_4_ =
           fVar65 * fVar22 + fVar58 * fVar41 + fVar59 * fVar63 +
           (pAVar12->l).vx.field_0.m128[2] * fVar56 + (pAVar13->l).vx.field_0.m128[2] * fVar14 + 0.0
      ;
      auVar21._8_4_ =
           fVar65 * fVar55 + fVar58 * fVar36 + fVar59 * fVar27 +
           (pAVar12->l).vy.field_0.m128[2] * fVar56 + (pAVar13->l).vy.field_0.m128[2] * fVar14 + 0.0
      ;
    }
    else {
      fVar19 = 1.0 - fVar14;
      fVar18 = (pAVar12->l).vx.field_0.m128[0] * fVar19 + (pAVar13->l).vx.field_0.m128[0] * fVar14;
      fVar15 = (pAVar12->l).vx.field_0.m128[1] * fVar19 + (pAVar13->l).vx.field_0.m128[1] * fVar14;
      fVar17 = (pAVar12->l).vx.field_0.m128[2] * fVar19 + (pAVar13->l).vx.field_0.m128[2] * fVar14;
      auVar32._0_4_ =
           (pAVar12->l).vy.field_0.m128[0] * fVar19 + (pAVar13->l).vy.field_0.m128[0] * fVar14;
      auVar32._4_4_ =
           (pAVar12->l).vy.field_0.m128[1] * fVar19 + (pAVar13->l).vy.field_0.m128[1] * fVar14;
      auVar32._8_4_ =
           (pAVar12->l).vy.field_0.m128[2] * fVar19 + (pAVar13->l).vy.field_0.m128[2] * fVar14;
      auVar24._0_4_ =
           (pAVar12->l).vz.field_0.m128[0] * fVar19 + (pAVar13->l).vz.field_0.m128[0] * fVar14;
      auVar24._4_4_ =
           (pAVar12->l).vz.field_0.m128[1] * fVar19 + (pAVar13->l).vz.field_0.m128[1] * fVar14;
      auVar24._8_4_ =
           (pAVar12->l).vz.field_0.m128[2] * fVar19 + (pAVar13->l).vz.field_0.m128[2] * fVar14;
      auVar21._0_4_ = fVar19 * (pAVar12->p).field_0.m128[0] + fVar14 * (pAVar13->p).field_0.m128[0];
      auVar21._4_4_ = fVar19 * (pAVar12->p).field_0.m128[1] + fVar14 * (pAVar13->p).field_0.m128[1];
      auVar21._8_4_ = fVar19 * (pAVar12->p).field_0.m128[2] + fVar14 * (pAVar13->p).field_0.m128[2];
    }
    fVar14 = auVar24._0_4_;
    fVar19 = auVar24._4_4_;
    fVar31 = auVar24._8_4_;
    fVar35 = auVar32._0_4_;
    fVar23 = auVar32._4_4_;
    fVar41 = auVar32._8_4_;
    auVar42._0_4_ = fVar35 * fVar19 - fVar23 * fVar14;
    fVar46 = fVar23 * fVar31 - fVar41 * fVar19;
    fVar47 = fVar41 * fVar14 - fVar35 * fVar31;
    auVar42._4_4_ = fVar14 * fVar15 - fVar19 * fVar18;
    auVar42._8_4_ = fVar18 * fVar23 - fVar15 * fVar35;
    auVar42._12_4_ = 0;
    auVar33._4_4_ = fVar19 * fVar17 - fVar31 * fVar15;
    auVar33._0_4_ = fVar46;
    auVar33._8_4_ = fVar15 * fVar41 - fVar17 * fVar23;
    auVar33._12_4_ = 0;
    auVar37._4_4_ = fVar31 * fVar18 - fVar14 * fVar17;
    auVar37._0_4_ = fVar47;
    auVar37._8_4_ = fVar17 * fVar35 - fVar18 * fVar41;
    auVar37._12_4_ = 0;
    fVar18 = fVar17 * auVar42._0_4_ + fVar15 * fVar47 + fVar18 * fVar46;
    auVar6._4_4_ = fVar18;
    auVar6._0_4_ = fVar18;
    auVar6._8_4_ = fVar18;
    auVar6._12_4_ = fVar18;
    auVar34 = divps(auVar33,auVar6);
    auVar7._4_4_ = fVar18;
    auVar7._0_4_ = fVar18;
    auVar7._8_4_ = fVar18;
    auVar7._12_4_ = fVar18;
    auVar38 = divps(auVar37,auVar7);
    auVar8._4_4_ = fVar18;
    auVar8._0_4_ = fVar18;
    auVar8._8_4_ = fVar18;
    auVar8._12_4_ = fVar18;
    auVar43 = divps(auVar42,auVar8);
    fVar17 = auVar21._0_4_;
    fVar19 = auVar21._4_4_;
    fVar31 = auVar21._8_4_;
    fVar18 = -(fVar17 * auVar34._0_4_ + fVar19 * auVar38._0_4_ + fVar31 * auVar43._0_4_);
    fVar15 = -(fVar17 * auVar34._4_4_ + fVar19 * auVar38._4_4_ + fVar31 * auVar43._4_4_);
    fVar14 = -(fVar17 * auVar34._8_4_ + fVar19 * auVar38._8_4_ + fVar31 * auVar43._8_4_);
    fVar17 = -(fVar17 * auVar34._12_4_ + fVar19 * auVar38._12_4_ + fVar31 * auVar43._12_4_);
  }
  fVar47 = auVar43._0_4_;
  fVar36 = auVar43._4_4_;
  fVar55 = auVar43._8_4_;
  fVar23 = auVar38._0_4_;
  fVar41 = auVar38._4_4_;
  fVar46 = auVar38._8_4_;
  fVar19 = auVar34._0_4_;
  fVar31 = auVar34._4_4_;
  fVar35 = auVar34._8_4_;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_78 = 0.0;
    if (((1e-05 < ABS(fVar46 * fVar35 + fVar41 * fVar31 + fVar23 * fVar19)) ||
        (1e-05 < ABS(fVar55 * fVar35 + fVar36 * fVar31 + fVar47 * fVar19))) ||
       (1e-05 < ABS(fVar55 * fVar46 + fVar36 * fVar41 + fVar47 * fVar23))) {
      bVar11 = false;
    }
    else {
      fVar20 = fVar35 * fVar35 + fVar31 * fVar31 + fVar19 * fVar19;
      fVar22 = fVar41 * fVar41 + fVar23 * fVar23 + fVar46 * fVar46;
      bVar11 = false;
      if (((ABS(fVar20 - fVar22) <= 1e-05) &&
          (fVar27 = fVar36 * fVar36 + fVar47 * fVar47 + fVar55 * fVar55, bVar11 = false,
          ABS(fVar20 - fVar27) <= 1e-05)) &&
         (fVar22 = ABS(fVar22 - fVar27), bVar11 = fVar22 <= 1e-05, fVar22 <= 1e-05)) {
        bVar11 = true;
        if (fVar20 < 0.0) {
          local_78 = sqrtf(fVar20);
        }
        else {
          local_78 = SQRT(fVar20);
        }
      }
    }
    local_90 = 2 - (uint)bVar11;
  }
  else {
    local_90 = 2;
    local_78 = 0.0;
  }
  pRVar4 = context->userContext;
  uVar10 = pRVar4->instStackSize;
  pRVar4->instID[uVar10] = prim->instID_;
  pRVar4->instPrimID[uVar10] = 0;
  *(undefined1 (*) [16])pRVar4->world2inst[uVar10] = auVar34;
  *(undefined1 (*) [16])(pRVar4->world2inst[uVar10] + 4) = auVar38;
  *(undefined1 (*) [16])(pRVar4->world2inst[uVar10] + 8) = auVar43;
  pfVar1 = pRVar4->world2inst[uVar10] + 0xc;
  *pfVar1 = fVar18;
  pfVar1[1] = fVar15;
  pfVar1[2] = fVar14;
  pfVar1[3] = fVar17;
  pafVar2 = pRVar4->inst2world + uVar10;
  (*pafVar2)[0] = fVar25;
  (*pafVar2)[1] = fVar28;
  (*pafVar2)[2] = fVar29;
  (*pafVar2)[3] = fVar30;
  pfVar1 = pRVar4->inst2world[uVar10] + 4;
  *pfVar1 = fVar50;
  pfVar1[1] = fVar54;
  pfVar1[2] = fVar62;
  pfVar1[3] = fVar61;
  pfVar1 = pRVar4->inst2world[uVar10] + 8;
  *pfVar1 = fVar51;
  pfVar1[1] = fVar53;
  pfVar1[2] = fVar48;
  pfVar1[3] = fVar49;
  pfVar1 = pRVar4->inst2world[uVar10] + 0xc;
  *pfVar1 = fVar16;
  pfVar1[1] = fVar57;
  pfVar1[2] = fVar26;
  pfVar1[3] = fVar60;
  pRVar4->instStackSize = pRVar4->instStackSize + 1;
  local_cc = query->time;
  fVar16 = (query->p).field_0.field_0.x;
  fVar57 = (query->p).field_0.field_0.y;
  fVar60 = (query->p).field_0.field_0.z;
  local_d8 = CONCAT44(fVar16 * fVar31 + fVar57 * fVar41 + fVar60 * fVar36 + fVar15,
                      fVar16 * fVar19 + fVar57 * fVar23 + fVar60 * fVar47 + fVar18);
  local_d0 = fVar16 * fVar35 + fVar57 * fVar46 + fVar60 * fVar55 + fVar14;
  local_c8 = query->radius * local_78;
  local_a8 = *(undefined8 *)&(pIVar3->super_Geometry).field_0x58;
  local_98 = context->query_ws;
  local_88 = context->func;
  local_80 = context->userContext;
  local_70 = context->userPtr;
  local_a0 = 0;
  local_68 = 0xffffffffffffffff;
  local_58 = local_98->radius;
  fVar16 = local_98->radius;
  if (local_90 == 2) {
    fStack_54 = fVar16;
    fStack_50 = fVar16;
    fStack_4c = fVar16;
    if ((fVar16 < INFINITY) && (local_80->instStackSize != 0)) {
      fStack_54 = local_58;
      fStack_50 = local_58;
      fStack_4c = local_58;
      pointQuery();
      fVar16 = local_48;
      fStack_54 = fStack_44;
      fStack_50 = fStack_40;
      fStack_4c = fStack_3c;
    }
  }
  else {
    fVar16 = local_78 * fVar16;
    fStack_54 = fVar16;
    fStack_50 = fVar16;
    fStack_4c = fVar16;
  }
  lVar5 = *(long *)&(pIVar3->super_Geometry).field_0x58;
  local_58 = fVar16;
  uVar9 = (**(code **)(lVar5 + 0x88))(lVar5 + 0x58,&local_d8);
  pRVar4 = context->userContext;
  uVar10 = pRVar4->instStackSize - 1;
  pRVar4->instStackSize = uVar10;
  pRVar4->instID[uVar10] = 0xffffffff;
  pRVar4->instPrimID[pRVar4->instStackSize] = 0xffffffff;
  return (bool)uVar9;
}

Assistant:

bool InstanceIntersector1MB::pointQuery(PointQuery* query, PointQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;

      const AffineSpace3fa local2world = instance->getLocal2World(query->time);
      const AffineSpace3fa world2local = instance->getWorld2Local(query->time);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, 0, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;
        
        PointQueryContext context_inst(
          (Scene*)instance->object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func, 
          context->userContext,
          similarityScale,
          context->userPtr); 

        bool changed = instance->object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }